

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::scan
               (InitScanner *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  ulong uVar2;
  long lVar3;
  _func_void_InitScanner_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(*pEVar1) {
  case (Expression)0x0:
  case (Expression)0x60:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case (Expression)0x1:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitBlock,currp);
    if (*pEVar1 != (Expression)0x1) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_0012088a:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,__function);
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 0x28)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(pEVar1 + 0x28) & 0x7fffffff);
      lVar3 = uVar2 * 8;
      uVar2 = uVar2 + 1;
      do {
        lVar3 = lVar3 + -8;
        if (*(ulong *)(pEVar1 + 0x28) <= uVar2 - 2) {
LAB_001204a5:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 0x20) + lVar3));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    break;
  case (Expression)0x2:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitIf,currp);
    if (*pEVar1 != (Expression)0x2) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_0012088a;
    }
    local_38 = pEVar1 + 0x20;
    local_40 = scan;
    if (*(long *)(pEVar1 + 0x20) != 0) {
      SmallVector<wasm::Walker<MetaDCEGraph::scanWebAssembly()::InitScanner,wasm::Visitor<MetaDCEGraph::scanWebAssembly()::InitScanner,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(MetaDCEGraph::scanWebAssembly()::InitScanner*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<MetaDCEGraph::scanWebAssembly()::InitScanner,wasm::Visitor<MetaDCEGraph::scanWebAssembly()::InitScanner,void>>::Task,10ul>
                  *)&(self->super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>).
                     super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x18));
    pEVar1 = pEVar1 + 0x10;
    goto LAB_001203f7;
  case (Expression)0x3:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitLoop,currp);
    if (*pEVar1 != (Expression)0x3) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_0012088a;
    }
    goto LAB_0011fdc8;
  case (Expression)0x4:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitBreak,currp);
    if (*pEVar1 != (Expression)0x4) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_0012088a;
    }
    local_38 = pEVar1 + 0x28;
    local_40 = scan;
    if (*(long *)(pEVar1 + 0x28) != 0) {
      SmallVector<wasm::Walker<MetaDCEGraph::scanWebAssembly()::InitScanner,wasm::Visitor<MetaDCEGraph::scanWebAssembly()::InitScanner,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(MetaDCEGraph::scanWebAssembly()::InitScanner*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<MetaDCEGraph::scanWebAssembly()::InitScanner,wasm::Visitor<MetaDCEGraph::scanWebAssembly()::InitScanner,void>>::Task,10ul>
                  *)&(self->super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>).
                     super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 0x20;
    if (*(long *)(pEVar1 + 0x20) == 0) {
      return;
    }
    goto LAB_0011fc2c;
  case (Expression)0x5:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSwitch,currp);
    if (*pEVar1 != (Expression)0x5) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_0012088a;
    }
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x48));
    local_38 = pEVar1 + 0x40;
    lVar3 = *(long *)(pEVar1 + 0x40);
    goto joined_r0x0011fc26;
  case (Expression)0x6:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitCall,currp);
    if (*pEVar1 != (Expression)0x6) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_0012088a;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 0x18)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(pEVar1 + 0x18) & 0x7fffffff);
      lVar3 = uVar2 * 8;
      uVar2 = uVar2 + 1;
      do {
        lVar3 = lVar3 + -8;
        if (*(ulong *)(pEVar1 + 0x18) <= uVar2 - 2) goto LAB_001204a5;
        Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 0x10) + lVar3));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    break;
  case (Expression)0x7:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitCallIndirect,currp);
    if (*pEVar1 != (Expression)0x7) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_0012088a;
    }
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x38));
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 0x20)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(pEVar1 + 0x20) & 0x7fffffff);
      lVar3 = uVar2 * 8;
      uVar2 = uVar2 + 1;
      do {
        lVar3 = lVar3 + -8;
        if (*(ulong *)(pEVar1 + 0x20) <= uVar2 - 2) goto LAB_001204a5;
        Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 0x18) + lVar3));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    break;
  case (Expression)0x8:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitLocalGet,currp);
    if (*pEVar1 != (Expression)0x8) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_0012088a;
    }
    break;
  case (Expression)0x9:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitLocalSet,currp);
    if (*pEVar1 != (Expression)0x9) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_0012088a;
    }
    goto LAB_001200c3;
  case (Expression)0xa:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitGlobalGet,currp);
    if (*pEVar1 != (Expression)0xa) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_0012088a;
    }
    break;
  case (Expression)0xb:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitGlobalSet,currp);
    if (*pEVar1 != (Expression)0xb) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_0012088a;
    }
    goto LAB_0011fdc8;
  case (Expression)0xc:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitLoad,currp);
    if (*pEVar1 != (Expression)0xc) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_0012088a;
    }
    pEVar1 = pEVar1 + 0x30;
    goto LAB_001202fb;
  case (Expression)0xd:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStore,currp);
    if (*pEVar1 != (Expression)0xd) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_0012088a;
    }
    goto LAB_0012008c;
  case (Expression)0xe:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitConst,currp);
    if (*pEVar1 != (Expression)0xe) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_0012088a;
    }
    break;
  case (Expression)0xf:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitUnary,currp);
    if (*pEVar1 != (Expression)0xf) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_0012088a;
    }
    goto LAB_001200c3;
  case (Expression)0x10:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitBinary,currp);
    if (*pEVar1 != (Expression)0x10) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_0012088a;
    }
    goto LAB_00120023;
  case (Expression)0x11:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSelect,currp);
    if (*pEVar1 != (Expression)0x11) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_0012088a;
    }
    goto LAB_001202d7;
  case (Expression)0x12:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitDrop,currp);
    if (*pEVar1 != (Expression)0x12) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_0012088a;
    }
    goto LAB_0011fe84;
  case (Expression)0x13:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitReturn,currp);
    if (*pEVar1 != (Expression)0x13) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_0012088a;
    }
    goto LAB_0011fc1d;
  case (Expression)0x14:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitMemorySize,currp);
    if (*pEVar1 != (Expression)0x14) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_0012088a;
    }
    break;
  case (Expression)0x15:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitMemoryGrow,currp);
    if (*pEVar1 != (Expression)0x15) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_0012088a;
    }
    goto LAB_0011fe84;
  case (Expression)0x16:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitNop,currp);
    if (*pEVar1 != (Expression)0x16) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_0012088a;
    }
    break;
  case (Expression)0x17:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitUnreachable,currp);
    if (*pEVar1 != (Expression)0x17) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_0012088a;
    }
    break;
  case (Expression)0x18:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitAtomicRMW,currp);
    if (*pEVar1 != (Expression)0x18) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_0012088a;
    }
    goto LAB_00120108;
  case (Expression)0x19:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitAtomicCmpxchg,currp);
    if (*pEVar1 != (Expression)0x19) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_0012088a;
    }
    goto LAB_001200f9;
  case (Expression)0x1a:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitAtomicWait,currp);
    if (*pEVar1 != (Expression)0x1a) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_0012088a;
    }
    goto LAB_0011fde9;
  case (Expression)0x1b:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitAtomicNotify,currp);
    if (*pEVar1 != (Expression)0x1b) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_0012088a;
    }
    goto LAB_00120023;
  case (Expression)0x1c:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitAtomicFence,currp);
    if (*pEVar1 != (Expression)0x1c) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_0012088a;
    }
    break;
  case (Expression)0x1d:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDExtract,currp);
    if (*pEVar1 != (Expression)0x1d) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_0012088a;
    }
    goto LAB_001200c3;
  case (Expression)0x1e:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDReplace,currp);
    if (*pEVar1 != (Expression)0x1e) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_0012088a;
    }
    currp_00 = pEVar1 + 0x28;
    goto LAB_0012002e;
  case (Expression)0x1f:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDShuffle,currp);
    if (*pEVar1 != (Expression)0x1f) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_0012088a;
    }
    goto LAB_001202e6;
  case (Expression)0x20:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDTernary,currp);
    if (*pEVar1 != (Expression)0x20) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_0012088a;
    }
    goto LAB_0011fde9;
  case (Expression)0x21:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDShift,currp);
    if (*pEVar1 != (Expression)0x21) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_0012088a;
    }
    goto LAB_00120023;
  case (Expression)0x22:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDLoad,currp);
    if (*pEVar1 != (Expression)0x22) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_0012088a;
    }
    goto LAB_0011ffa8;
  case (Expression)0x23:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDLoadStoreLane,
               currp);
    if (*pEVar1 != (Expression)0x23) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_0012088a;
    }
LAB_0012008c:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x38));
    pEVar1 = pEVar1 + 0x30;
    goto LAB_001202fb;
  case (Expression)0x24:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitMemoryInit,currp);
    if (*pEVar1 != (Expression)0x24) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_0012088a;
    }
    goto LAB_001200f9;
  case (Expression)0x25:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitDataDrop,currp);
    if (*pEVar1 != (Expression)0x25) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_0012088a;
    }
    break;
  case (Expression)0x26:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitMemoryCopy,currp);
    if (*pEVar1 != (Expression)0x26) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_0012088a;
    }
    goto LAB_001202d7;
  case (Expression)0x27:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitMemoryFill,currp);
    if (*pEVar1 != (Expression)0x27) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_0012088a;
    }
    goto LAB_001202d7;
  case (Expression)0x28:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitPop,currp);
    if (*pEVar1 != (Expression)0x28) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_0012088a;
    }
    break;
  case (Expression)0x29:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefNull,currp);
    if (*pEVar1 != (Expression)0x29) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_0012088a;
    }
    break;
  case (Expression)0x2a:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefIsNull,currp);
    if (*pEVar1 != (Expression)0x2a) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_0012088a;
    }
    goto LAB_0011fe84;
  case (Expression)0x2b:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefFunc,currp);
    if (*pEVar1 != (Expression)0x2b) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_0012088a;
    }
    break;
  case (Expression)0x2c:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefEq,currp);
    if (*pEVar1 != (Expression)0x2c) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_0012088a;
    }
    goto LAB_001202e6;
  case (Expression)0x2d:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableGet,currp);
    if (*pEVar1 != (Expression)0x2d) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_0012088a;
    }
    goto LAB_0011fdc8;
  case (Expression)0x2e:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableSet,currp);
    if (*pEVar1 != (Expression)0x2e) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_0012088a;
    }
    goto LAB_00120108;
  case (Expression)0x2f:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableSize,currp);
    if (*pEVar1 != (Expression)0x2f) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_0012088a;
    }
    break;
  case (Expression)0x30:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableGrow,currp);
    if (*pEVar1 != (Expression)0x30) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_0012088a;
    }
    goto LAB_00120108;
  case (Expression)0x31:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableFill,currp);
    if (*pEVar1 != (Expression)0x31) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableFill]";
      goto LAB_0012088a;
    }
    goto LAB_001200f9;
  case (Expression)0x32:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableCopy,currp);
    if (*pEVar1 != (Expression)0x32) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableCopy]";
      goto LAB_0012088a;
    }
    goto LAB_001202d7;
  case (Expression)0x33:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableInit,currp);
    if (*pEVar1 != (Expression)0x33) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableInit]";
      goto LAB_0012088a;
    }
    goto LAB_001200f9;
  case (Expression)0x34:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTry,currp);
    if (*pEVar1 != (Expression)0x34) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_0012088a;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 0x50)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(pEVar1 + 0x50) & 0x7fffffff);
      lVar3 = uVar2 * 8;
      uVar2 = uVar2 + 1;
      do {
        lVar3 = lVar3 + -8;
        if (*(ulong *)(pEVar1 + 0x50) <= uVar2 - 2) goto LAB_001204a5;
        Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 0x48) + lVar3));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
LAB_0011fdc8:
    pEVar1 = pEVar1 + 0x20;
    goto LAB_001202fb;
  case (Expression)0x35:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTryTable,currp);
    if (*pEVar1 != (Expression)0x35) {
      __function = "T *wasm::Expression::cast() [T = wasm::TryTable]";
      goto LAB_0012088a;
    }
    goto LAB_0011fe84;
  case (Expression)0x36:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitThrow,currp);
    if (*pEVar1 != (Expression)0x36) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_0012088a;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 0x28)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(pEVar1 + 0x28) & 0x7fffffff);
      lVar3 = uVar2 * 8;
      uVar2 = uVar2 + 1;
      do {
        lVar3 = lVar3 + -8;
        if (*(ulong *)(pEVar1 + 0x28) <= uVar2 - 2) goto LAB_001204a5;
        Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 0x20) + lVar3));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    break;
  case (Expression)0x37:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRethrow,currp);
    if (*pEVar1 != (Expression)0x37) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_0012088a;
    }
    break;
  case (Expression)0x38:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitThrowRef,currp);
    if (*pEVar1 != (Expression)0x38) {
      __function = "T *wasm::Expression::cast() [T = wasm::ThrowRef]";
      goto LAB_0012088a;
    }
    goto LAB_0011fe84;
  case (Expression)0x39:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTupleMake,currp);
    if (*pEVar1 != (Expression)0x39) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_0012088a;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 0x18)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(pEVar1 + 0x18) & 0x7fffffff);
      lVar3 = uVar2 * 8;
      uVar2 = uVar2 + 1;
      do {
        lVar3 = lVar3 + -8;
        if (*(ulong *)(pEVar1 + 0x18) <= uVar2 - 2) goto LAB_001204a5;
        Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 0x10) + lVar3));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    break;
  case (Expression)0x3a:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTupleExtract,currp);
    if (*pEVar1 != (Expression)0x3a) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_0012088a;
    }
    goto LAB_0011fe84;
  case (Expression)0x3b:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefI31,currp);
    if (*pEVar1 != (Expression)0x3b) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefI31]";
      goto LAB_0012088a;
    }
    goto LAB_0011fe84;
  case (Expression)0x3c:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitI31Get,currp);
    if (*pEVar1 != (Expression)0x3c) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_0012088a;
    }
    goto LAB_0011fe84;
  case (Expression)0x3d:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitCallRef,currp);
    if (*pEVar1 != (Expression)0x3d) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_0012088a;
    }
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x30));
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 0x18)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(pEVar1 + 0x18) & 0x7fffffff);
      lVar3 = uVar2 * 8;
      uVar2 = uVar2 + 1;
      do {
        lVar3 = lVar3 + -8;
        if (*(ulong *)(pEVar1 + 0x18) <= uVar2 - 2) goto LAB_001204a5;
        Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 0x10) + lVar3));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    break;
  case (Expression)0x3e:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefTest,currp);
    if (*pEVar1 != (Expression)0x3e) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_0012088a;
    }
    goto LAB_0011fe84;
  case (Expression)0x3f:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefCast,currp);
    if (*pEVar1 != (Expression)0x3f) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_0012088a;
    }
    goto LAB_0011fe84;
  case (Expression)0x40:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitBrOn,currp);
    if (*pEVar1 != (Expression)0x40) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_0012088a;
    }
LAB_0011ffa8:
    pEVar1 = pEVar1 + 0x28;
    goto LAB_001202fb;
  case (Expression)0x41:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStructNew,currp);
    if (*pEVar1 != (Expression)0x41) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_0012088a;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 0x18)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(pEVar1 + 0x18) & 0x7fffffff);
      lVar3 = uVar2 * 8;
      uVar2 = uVar2 + 1;
      do {
        lVar3 = lVar3 + -8;
        if (*(ulong *)(pEVar1 + 0x18) <= uVar2 - 2) goto LAB_001204a5;
        Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 0x10) + lVar3));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    break;
  case (Expression)0x42:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStructGet,currp);
    if (*pEVar1 != (Expression)0x42) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_0012088a;
    }
    goto LAB_001200c3;
  case (Expression)0x43:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStructSet,currp);
    if (*pEVar1 != (Expression)0x43) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_0012088a;
    }
    goto LAB_00120023;
  case (Expression)0x44:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStructRMW,currp);
    if (*pEVar1 != (Expression)0x44) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructRMW]";
      goto LAB_0012088a;
    }
    goto LAB_00120023;
  case (Expression)0x45:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStructCmpxchg,currp);
    if (*pEVar1 != (Expression)0x45) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructCmpxchg]";
      goto LAB_0012088a;
    }
LAB_0011fde9:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x28));
    currp_00 = pEVar1 + 0x20;
    goto LAB_0012002e;
  case (Expression)0x46:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayNew,currp);
    if (*pEVar1 != (Expression)0x46) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_0012088a;
    }
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x18));
LAB_0011fc1d:
    local_38 = pEVar1 + 0x10;
    lVar3 = *(long *)(pEVar1 + 0x10);
joined_r0x0011fc26:
    if (lVar3 != 0) {
LAB_0011fc2c:
      local_40 = scan;
      SmallVector<wasm::Walker<MetaDCEGraph::scanWebAssembly()::InitScanner,wasm::Visitor<MetaDCEGraph::scanWebAssembly()::InitScanner,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(MetaDCEGraph::scanWebAssembly()::InitScanner*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<MetaDCEGraph::scanWebAssembly()::InitScanner,wasm::Visitor<MetaDCEGraph::scanWebAssembly()::InitScanner,void>>::Task,10ul>
                  *)&(self->super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>).
                     super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    break;
  case (Expression)0x47:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayNewData,currp);
    if (*pEVar1 != (Expression)0x47) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewData]";
      goto LAB_0012088a;
    }
    goto LAB_00120108;
  case (Expression)0x48:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayNewElem,currp);
    if (*pEVar1 != (Expression)0x48) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewElem]";
      goto LAB_0012088a;
    }
    goto LAB_00120108;
  case (Expression)0x49:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayNewFixed,currp);
    if (*pEVar1 != (Expression)0x49) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_0012088a;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 0x18)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(pEVar1 + 0x18) & 0x7fffffff);
      lVar3 = uVar2 * 8;
      uVar2 = uVar2 + 1;
      do {
        lVar3 = lVar3 + -8;
        if (*(ulong *)(pEVar1 + 0x18) <= uVar2 - 2) goto LAB_001204a5;
        Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 0x10) + lVar3));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    break;
  case (Expression)0x4a:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayGet,currp);
    if (*pEVar1 != (Expression)0x4a) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_0012088a;
    }
    goto LAB_001202e6;
  case (Expression)0x4b:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArraySet,currp);
    if (*pEVar1 != (Expression)0x4b) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_0012088a;
    }
    goto LAB_001202d7;
  case (Expression)0x4c:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayLen,currp);
    if (*pEVar1 != (Expression)0x4c) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_0012088a;
    }
    goto LAB_0011fe84;
  case (Expression)0x4d:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayCopy,currp);
    if (*pEVar1 != (Expression)0x4d) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_0012088a;
    }
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x30));
    goto LAB_001202c8;
  case (Expression)0x4e:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayFill,currp);
    if (*pEVar1 != (Expression)0x4e) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_0012088a;
    }
LAB_001202c8:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x28));
    goto LAB_001202d7;
  case (Expression)0x4f:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayInitData,currp);
    if (*pEVar1 != (Expression)0x4f) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitData]";
      goto LAB_0012088a;
    }
    goto LAB_0011f6f8;
  case (Expression)0x50:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayInitElem,currp);
    if (*pEVar1 != (Expression)0x50) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitElem]";
      goto LAB_0012088a;
    }
LAB_0011f6f8:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x38));
LAB_001200f9:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x30));
LAB_00120108:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x28));
    pEVar1 = pEVar1 + 0x20;
    goto LAB_001202fb;
  case (Expression)0x51:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefAs,currp);
    if (*pEVar1 != (Expression)0x51) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_0012088a;
    }
    goto LAB_001200c3;
  case (Expression)0x52:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringNew,currp);
    if (*pEVar1 != (Expression)0x52) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_0012088a;
    }
    local_38 = pEVar1 + 0x28;
    local_40 = scan;
    if (*(long *)(pEVar1 + 0x28) != 0) {
      SmallVector<wasm::Walker<MetaDCEGraph::scanWebAssembly()::InitScanner,wasm::Visitor<MetaDCEGraph::scanWebAssembly()::InitScanner,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(MetaDCEGraph::scanWebAssembly()::InitScanner*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<MetaDCEGraph::scanWebAssembly()::InitScanner,wasm::Visitor<MetaDCEGraph::scanWebAssembly()::InitScanner,void>>::Task,10ul>
                  *)&(self->super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>).
                     super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 0x20;
    local_40 = scan;
    if (*(long *)(pEVar1 + 0x20) != 0) {
      SmallVector<wasm::Walker<MetaDCEGraph::scanWebAssembly()::InitScanner,wasm::Visitor<MetaDCEGraph::scanWebAssembly()::InitScanner,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(MetaDCEGraph::scanWebAssembly()::InitScanner*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<MetaDCEGraph::scanWebAssembly()::InitScanner,wasm::Visitor<MetaDCEGraph::scanWebAssembly()::InitScanner,void>>::Task,10ul>
                  *)&(self->super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>).
                     super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    pEVar1 = pEVar1 + 0x18;
    goto LAB_001203f7;
  case (Expression)0x53:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringConst,currp);
    if (*pEVar1 != (Expression)0x53) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_0012088a;
    }
    break;
  case (Expression)0x54:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringMeasure,currp);
    if (*pEVar1 != (Expression)0x54) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_0012088a;
    }
LAB_001200c3:
    pEVar1 = pEVar1 + 0x18;
    goto LAB_001202fb;
  case (Expression)0x55:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringEncode,currp);
    if (*pEVar1 != (Expression)0x55) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_0012088a;
    }
    local_38 = pEVar1 + 0x28;
    local_40 = scan;
    if (*(long *)(pEVar1 + 0x28) != 0) {
      SmallVector<wasm::Walker<MetaDCEGraph::scanWebAssembly()::InitScanner,wasm::Visitor<MetaDCEGraph::scanWebAssembly()::InitScanner,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(MetaDCEGraph::scanWebAssembly()::InitScanner*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<MetaDCEGraph::scanWebAssembly()::InitScanner,wasm::Visitor<MetaDCEGraph::scanWebAssembly()::InitScanner,void>>::Task,10ul>
                  *)&(self->super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>).
                     super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x20));
    pEVar1 = pEVar1 + 0x18;
LAB_001203f7:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)pEVar1);
    break;
  case (Expression)0x56:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringConcat,currp);
    if (*pEVar1 != (Expression)0x56) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_0012088a;
    }
    goto LAB_001202e6;
  case (Expression)0x57:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringEq,currp);
    if (*pEVar1 != (Expression)0x57) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_0012088a;
    }
LAB_00120023:
    currp_00 = pEVar1 + 0x20;
LAB_0012002e:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)currp_00);
    pEVar1 = pEVar1 + 0x18;
    goto LAB_001202fb;
  case (Expression)0x58:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringWTF16Get,currp);
    if (*pEVar1 != (Expression)0x58) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_0012088a;
    }
    goto LAB_001202e6;
  case (Expression)0x59:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringSliceWTF,currp);
    if (*pEVar1 != (Expression)0x59) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_0012088a;
    }
LAB_001202d7:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x20));
LAB_001202e6:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x18));
    pEVar1 = pEVar1 + 0x10;
    goto LAB_001202fb;
  case (Expression)0x5a:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitContNew,currp);
    if (*pEVar1 != (Expression)0x5a) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContNew]";
      goto LAB_0012088a;
    }
LAB_0011fe84:
    pEVar1 = pEVar1 + 0x10;
LAB_001202fb:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)pEVar1);
    return;
  case (Expression)0x5b:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitContBind,currp);
    if (*pEVar1 != (Expression)0x5b) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContBind]";
      goto LAB_0012088a;
    }
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x30));
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 0x18)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(pEVar1 + 0x18) & 0x7fffffff);
      lVar3 = uVar2 * 8;
      uVar2 = uVar2 + 1;
      do {
        lVar3 = lVar3 + -8;
        if (*(ulong *)(pEVar1 + 0x18) <= uVar2 - 2) goto LAB_001204a5;
        Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 0x10) + lVar3));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    break;
  case (Expression)0x5c:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSuspend,currp);
    if (*pEVar1 != (Expression)0x5c) {
      __function = "T *wasm::Expression::cast() [T = wasm::Suspend]";
      goto LAB_0012088a;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 0x28)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(pEVar1 + 0x28) & 0x7fffffff);
      lVar3 = uVar2 * 8;
      uVar2 = uVar2 + 1;
      do {
        lVar3 = lVar3 + -8;
        if (*(ulong *)(pEVar1 + 0x28) <= uVar2 - 2) goto LAB_001204a5;
        Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 0x20) + lVar3));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    break;
  case (Expression)0x5d:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitResume,currp);
    if (*pEVar1 != (Expression)0x5d) {
      __function = "T *wasm::Expression::cast() [T = wasm::Resume]";
      goto LAB_0012088a;
    }
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x70));
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 0x58)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(pEVar1 + 0x58) & 0x7fffffff);
      lVar3 = uVar2 * 8;
      uVar2 = uVar2 + 1;
      do {
        lVar3 = lVar3 + -8;
        if (*(ulong *)(pEVar1 + 0x58) <= uVar2 - 2) goto LAB_001204a5;
        Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 0x50) + lVar3));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    break;
  case (Expression)0x5e:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitResumeThrow,currp);
    if (*pEVar1 != (Expression)0x5e) {
      __function = "T *wasm::Expression::cast() [T = wasm::ResumeThrow]";
      goto LAB_0012088a;
    }
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x80));
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 0x68)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(pEVar1 + 0x68) & 0x7fffffff);
      lVar3 = uVar2 * 8;
      uVar2 = uVar2 + 1;
      do {
        lVar3 = lVar3 + -8;
        if (*(ulong *)(pEVar1 + 0x68) <= uVar2 - 2) goto LAB_001204a5;
        Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 0x60) + lVar3));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    break;
  case (Expression)0x5f:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStackSwitch,currp);
    if (*pEVar1 != (Expression)0x5f) {
      __function = "T *wasm::Expression::cast() [T = wasm::StackSwitch]";
      goto LAB_0012088a;
    }
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 0x40));
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 0x28)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(pEVar1 + 0x28) & 0x7fffffff);
      lVar3 = uVar2 * 8;
      uVar2 = uVar2 + 1;
      do {
        lVar3 = lVar3 + -8;
        if (*(ulong *)(pEVar1 + 0x28) <= uVar2 - 2) goto LAB_001204a5;
        Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 0x20) + lVar3));
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }